

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::_::ExclusiveJoinPromiseNode::Branch::~Branch(Branch *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_0064c898;
  pPVar1 = (this->dependency).ptr;
  if (pPVar1 != (PromiseNode *)0x0) {
    (this->dependency).ptr = (PromiseNode *)0x0;
    pDVar2 = (this->dependency).disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  Event::~Event(&this->super_Event);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::~Branch() noexcept(false) {}